

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool art_node256_internal_validate
                (art_t *art,art_node256_t *node,art_internal_validate_t validator)

{
  _Bool _Var1;
  long in_RSI;
  art_ref_t in_RDI;
  art_internal_validate_t in_stack_00000010;
  int j;
  int i;
  int actual_count;
  int local_24;
  int local_20;
  uint local_1c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (*(ushort *)(in_RSI + 6) < 0x31) {
    _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                              "Node256 has too few children");
  }
  else if (*(ushort *)(in_RSI + 6) < 0x101) {
    in_stack_00000010.context._0_4_ = (int)in_stack_00000010.context + 1;
    local_1c = 0;
    for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
      if (*(long *)(in_RSI + 8 + (long)local_20 * 8) != 0) {
        local_1c = local_1c + 1;
        local_24 = local_20;
        while (local_24 = local_24 + 1, local_24 < 0x100) {
          if (*(long *)(in_RSI + 8 + (long)local_20 * 8) ==
              *(long *)(in_RSI + 8 + (long)local_24 * 8)) {
            _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                      "Node256 has duplicate children");
            return _Var1;
          }
        }
        ((undefined1 *)((long)register0x00000020 + 0x24))[(int)in_stack_00000010.context + -1] =
             (char)local_20;
        _Var1 = art_internal_validate_at
                          ((art_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           in_RDI,in_stack_00000010);
        if (!_Var1) {
          return false;
        }
      }
    }
    if (local_1c == *(ushort *)(in_RSI + 6)) {
      _Var1 = true;
    }
    else {
      _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                "Node256 count does not match actual children");
    }
  }
  else {
    _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                              "Node256 has too many children");
  }
  return _Var1;
}

Assistant:

static bool art_node256_internal_validate(const art_t *art,
                                          const art_node256_t *node,
                                          art_internal_validate_t validator) {
    if (node->count <= 48) {
        return art_validate_fail(&validator, "Node256 has too few children");
    }
    if (node->count > 256) {
        return art_validate_fail(&validator, "Node256 has too many children");
    }
    validator.depth++;
    int actual_count = 0;
    for (int i = 0; i < 256; ++i) {
        if (node->children[i] != CROARING_ART_NULL_REF) {
            actual_count++;

            for (int j = i + 1; j < 256; ++j) {
                if (node->children[i] == node->children[j]) {
                    return art_validate_fail(&validator,
                                             "Node256 has duplicate children");
                }
            }

            validator.current_key[validator.depth - 1] = i;
            if (!art_internal_validate_at(art, node->children[i], validator)) {
                return false;
            }
        }
    }
    if (actual_count != node->count) {
        return art_validate_fail(
            &validator, "Node256 count does not match actual children");
    }
    return true;
}